

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSymStr.c
# Opt level: O3

void Sim_SymmsStructCompute(Abc_Ntk_t *pNtk,Vec_Ptr_t *vMatrs,Vec_Ptr_t *vSuppFun)

{
  size_t __size;
  void *pvVar1;
  Abc_Obj_t *pNode;
  Extra_BitMat_t *p;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  void *pvVar6;
  int *pMap;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  Vec_Ptr_t *vNodesPi;
  Vec_Ptr_t *vNodesPi_00;
  Vec_Ptr_t *vNodesOther;
  Abc_Obj_t *vSymms;
  Abc_Obj_t *pAVar9;
  uint uVar10;
  ulong uVar11;
  int *piVar12;
  int *piVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  int *piVar19;
  int *piVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  
  if (0xfff5 < pNtk->vCis->nSize) {
    __assert_fail("Abc_NtkCiNum(pNtk) + 10 < (1<<16)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sim/simSymStr.c"
                  ,0x43,"void Sim_SymmsStructCompute(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  pVVar5 = Sim_ComputeStrSupp(pNtk);
  pNtk->vSupps = pVVar5;
  pVVar5 = pNtk->vCis;
  uVar22 = (ulong)(uint)pVVar5->nSize;
  if (0 < pVVar5->nSize) {
    lVar23 = 0;
    do {
      pvVar1 = pVVar5->pArray[lVar23];
      pvVar6 = calloc(1,0x10);
      *(void **)((long)pvVar1 + 0x40) = pvVar6;
      lVar23 = lVar23 + 1;
      pVVar5 = pNtk->vCis;
      uVar22 = (ulong)pVVar5->nSize;
    } while (lVar23 < (long)uVar22);
  }
  lVar23 = (long)pNtk->vObjs->nSize;
  __size = lVar23 * 4;
  pMap = (int *)malloc(__size);
  if (0 < lVar23) {
    memset(pMap,0xff,__size);
  }
  if (0 < (int)uVar22) {
    ppvVar8 = pVVar5->pArray;
    uVar11 = 0;
    do {
      pMap[*(int *)((long)ppvVar8[uVar11] + 0x10)] = (int)uVar11;
      uVar11 = uVar11 + 1;
    } while ((uVar22 & 0xffffffff) != uVar11);
  }
  pVVar5 = Abc_NtkDfs(pNtk,0);
  if (0 < pVVar5->nSize) {
    lVar23 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar5->pArray[lVar23];
      pVVar7 = (Vec_Ptr_t *)malloc(0x10);
      pVVar7->nCap = 10;
      pVVar7->nSize = 0;
      ppvVar8 = (void **)malloc(0x50);
      pVVar7->pArray = ppvVar8;
      vNodesPi = (Vec_Ptr_t *)malloc(0x10);
      vNodesPi->nCap = 10;
      vNodesPi->nSize = 0;
      ppvVar8 = (void **)malloc(0x50);
      vNodesPi->pArray = ppvVar8;
      vNodesPi_00 = (Vec_Ptr_t *)malloc(0x10);
      vNodesPi_00->nCap = 10;
      vNodesPi_00->nSize = 0;
      ppvVar8 = (void **)malloc(0x50);
      vNodesPi_00->pArray = ppvVar8;
      vNodesOther = (Vec_Ptr_t *)malloc(0x10);
      vNodesOther->nCap = 10;
      vNodesOther->nSize = 0;
      ppvVar8 = (void **)malloc(0x50);
      vNodesOther->pArray = ppvVar8;
      Sim_SymmsBalanceCollect_rec(pNode,pVVar7);
      iVar4 = pVVar7->nSize;
      if (0 < (long)iVar4) {
        piVar13 = &vNodesPi->nSize;
        piVar19 = &vNodesPi_00->nSize;
        piVar20 = &vNodesOther->nSize;
        uVar22 = 10;
        uVar10 = 10;
        uVar17 = 10;
        lVar15 = 0;
        do {
          pvVar1 = pVVar7->pArray[lVar15];
          uVar2 = *(uint *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 0x14) & 0xf;
          uVar18 = (uint)uVar22;
          if ((uVar2 == 2) || (uVar2 == 5)) {
            if (((ulong)pvVar1 & 1) == 0) {
              piVar12 = piVar19;
              if (*piVar19 == uVar10) {
                uVar18 = uVar10;
                if ((int)uVar10 < 0x10) {
                  if (vNodesPi_00->pArray == (void **)0x0) {
                    ppvVar8 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar8 = (void **)realloc(vNodesPi_00->pArray,0x80);
                  }
                  vNodesPi_00->pArray = ppvVar8;
                  vNodesPi_00->nCap = 0x10;
                  uVar10 = 0x10;
                }
                else {
                  uVar10 = uVar10 * 2;
                  if (vNodesPi_00->pArray == (void **)0x0) {
                    ppvVar8 = (void **)malloc((ulong)uVar10 * 8);
                  }
                  else {
                    ppvVar8 = (void **)realloc(vNodesPi_00->pArray,(ulong)uVar10 * 8);
                  }
                  vNodesPi_00->pArray = ppvVar8;
                  vNodesPi_00->nCap = uVar10;
                }
              }
              else {
                ppvVar8 = vNodesPi_00->pArray;
                uVar18 = *piVar19;
              }
            }
            else {
              piVar12 = piVar13;
              if (*piVar13 == uVar17) {
                uVar18 = uVar17;
                if ((int)uVar17 < 0x10) {
                  if (vNodesPi->pArray == (void **)0x0) {
                    ppvVar8 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar8 = (void **)realloc(vNodesPi->pArray,0x80);
                  }
                  vNodesPi->pArray = ppvVar8;
                  vNodesPi->nCap = 0x10;
                  uVar17 = 0x10;
                }
                else {
                  uVar17 = uVar17 * 2;
                  if (vNodesPi->pArray == (void **)0x0) {
                    ppvVar8 = (void **)malloc((ulong)uVar17 * 8);
                  }
                  else {
                    ppvVar8 = (void **)realloc(vNodesPi->pArray,(ulong)uVar17 * 8);
                  }
                  vNodesPi->pArray = ppvVar8;
                  vNodesPi->nCap = uVar17;
                }
              }
              else {
                ppvVar8 = vNodesPi->pArray;
                uVar18 = *piVar13;
              }
            }
          }
          else {
            piVar12 = piVar20;
            if (*piVar20 == uVar18) {
              if ((int)uVar18 < 0x10) {
                if (vNodesOther->pArray == (void **)0x0) {
                  ppvVar8 = (void **)malloc(0x80);
                }
                else {
                  ppvVar8 = (void **)realloc(vNodesOther->pArray,0x80);
                }
                vNodesOther->pArray = ppvVar8;
                vNodesOther->nCap = 0x10;
                uVar22 = 0x10;
              }
              else {
                uVar22 = (ulong)(uVar18 * 2);
                if (vNodesOther->pArray == (void **)0x0) {
                  ppvVar8 = (void **)malloc(uVar22 * 8);
                }
                else {
                  ppvVar8 = (void **)realloc(vNodesOther->pArray,uVar22 * 8);
                }
                vNodesOther->pArray = ppvVar8;
                vNodesOther->nCap = uVar18 * 2;
              }
            }
            else {
              ppvVar8 = vNodesOther->pArray;
              uVar18 = *piVar20;
            }
          }
          *piVar12 = uVar18 + 1;
          ppvVar8[(int)uVar18] = pvVar1;
          lVar15 = lVar15 + 1;
        } while (iVar4 != lVar15);
      }
      vSymms = (Abc_Obj_t *)malloc(0x10);
      vSymms->pNtk = (Abc_Ntk_t *)0x10;
      pAVar9 = (Abc_Obj_t *)malloc(0x40);
      vSymms->pNext = pAVar9;
      Sim_SymmsAppendFromGroup(pNtk,vNodesPi,vNodesOther,(Vec_Int_t *)vSymms,pMap);
      pAVar9 = vSymms;
      Sim_SymmsAppendFromGroup(pNtk,vNodesPi_00,vNodesOther,(Vec_Int_t *)vSymms,pMap);
      iVar4 = vNodesOther->nSize;
      if (0 < (long)iVar4) {
        ppvVar8 = vNodesOther->pArray;
        lVar15 = 0;
        do {
          lVar14 = *(long *)(((ulong)ppvVar8[lVar15] & 0xfffffffffffffffe) + 0x40);
          iVar21 = *(int *)(lVar14 + 4);
          if (0 < iVar21) {
            lVar16 = 0;
            do {
              uVar10 = *(uint *)(*(long *)(lVar14 + 8) + lVar16 * 4);
              iVar3 = Sim_SymmsIsCompatibleWithNodes(pNtk,uVar10,vNodesOther,(int *)pAVar9);
              if (((iVar3 != 0) &&
                  (iVar3 = Sim_SymmsIsCompatibleWithGroup(uVar10,vNodesPi,pMap), iVar3 != 0)) &&
                 (iVar3 = Sim_SymmsIsCompatibleWithGroup(uVar10,vNodesPi_00,pMap), iVar3 != 0)) {
                Vec_IntPushUnique((Vec_Int_t *)vSymms,uVar10);
                iVar21 = *(int *)(lVar14 + 4);
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 < iVar21);
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != iVar4);
      }
      if (pVVar7->pArray != (void **)0x0) {
        free(pVVar7->pArray);
      }
      free(pVVar7);
      if (vNodesPi->pArray != (void **)0x0) {
        free(vNodesPi->pArray);
      }
      free(vNodesPi);
      if (vNodesPi_00->pArray != (void **)0x0) {
        free(vNodesPi_00->pArray);
      }
      free(vNodesPi_00);
      if (vNodesOther->pArray != (void **)0x0) {
        free(vNodesOther->pArray);
      }
      free(vNodesOther);
      (pNode->field_6).pCopy = vSymms;
      lVar23 = lVar23 + 1;
    } while (lVar23 < pVVar5->nSize);
  }
  pVVar7 = pNtk->vCos;
  if (0 < pVVar7->nSize) {
    lVar23 = 0;
    do {
      uVar22 = *(ulong *)(*(long *)(*(long *)(*pVVar7->pArray[lVar23] + 0x20) + 8) +
                         (long)**(int **)((long)pVVar7->pArray[lVar23] + 0x20) * 8);
      uVar10 = *(uint *)(uVar22 + 0x14) & 0xf;
      if ((uVar10 != 2) && (uVar10 != 5)) {
        if (**(int **)(uVar22 & 0xfffffffffffffffe) != 3) {
          __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,0x18e,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
        }
        if ((*(uint *)((long)(uVar22 & 0xfffffffffffffffe) + 0x14) & 0xf) != 1) {
          if ((vMatrs->nSize <= lVar23) || (vSuppFun->nSize <= lVar23)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          p = (Extra_BitMat_t *)vMatrs->pArray[lVar23];
          lVar15 = *(long *)(uVar22 + 0x40);
          pvVar1 = vSuppFun->pArray[lVar23];
          iVar4 = Extra_BitMatrixReadSize(p);
          if (0 < iVar4) {
            iVar21 = 0;
            do {
              Extra_BitMatrixInsert1(p,iVar21,iVar21);
              iVar21 = iVar21 + 1;
            } while (iVar4 != iVar21);
          }
          iVar4 = *(int *)(lVar15 + 4);
          if (0 < iVar4) {
            lVar14 = 0;
            do {
              uVar10 = *(uint *)(*(long *)(lVar15 + 8) + lVar14 * 4);
              uVar17 = 1 << ((byte)uVar10 & 0x1f) &
                       *(uint *)((long)pvVar1 + (ulong)(uVar10 >> 3 & 0x1ffc));
              uVar18 = 1 << ((byte)(uVar10 >> 0x10) & 0x1f) &
                       *(uint *)((long)pvVar1 + (ulong)(uVar10 >> 0x15) * 4);
              if ((uVar17 != 0) != (uVar18 != 0)) {
                __assert_fail("Sim_HasBit(pSupport, Ind1) == Sim_HasBit(pSupport, Ind2)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sim/simSymStr.c"
                              ,0x1c5,
                              "void Sim_SymmsTransferToMatrix(Extra_BitMat_t *, Vec_Int_t *, unsigned int *)"
                             );
              }
              if ((uVar17 != 0) && (uVar18 != 0)) {
                Extra_BitMatrixInsert1(p,uVar10 & 0xffff,uVar10 >> 0x10);
                Extra_BitMatrixInsert2(p,uVar10 & 0xffff,uVar10 >> 0x10);
                iVar4 = *(int *)(lVar15 + 4);
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 < iVar4);
          }
        }
      }
      lVar23 = lVar23 + 1;
      pVVar7 = pNtk->vCos;
    } while (lVar23 < pVVar7->nSize);
  }
  Sim_UtilInfoFree(pNtk->vSupps);
  pNtk->vSupps = (Vec_Ptr_t *)0x0;
  pVVar7 = pNtk->vCis;
  if (0 < pVVar7->nSize) {
    lVar23 = 0;
    do {
      pvVar1 = *(void **)((long)pVVar7->pArray[lVar23] + 0x40);
      pvVar6 = *(void **)((long)pvVar1 + 8);
      if (pvVar6 != (void *)0x0) {
        free(pvVar6);
      }
      free(pvVar1);
      lVar23 = lVar23 + 1;
      pVVar7 = pNtk->vCis;
    } while (lVar23 < pVVar7->nSize);
  }
  if (0 < pVVar5->nSize) {
    lVar23 = 0;
    do {
      pvVar1 = *(void **)((long)pVVar5->pArray[lVar23] + 0x40);
      pvVar6 = *(void **)((long)pvVar1 + 8);
      if (pvVar6 != (void *)0x0) {
        free(pvVar6);
      }
      free(pvVar1);
      lVar23 = lVar23 + 1;
    } while (lVar23 < pVVar5->nSize);
  }
  if (pVVar5->pArray != (void **)0x0) {
    free(pVVar5->pArray);
  }
  free(pVVar5);
  if (pMap == (int *)0x0) {
    return;
  }
  free(pMap);
  return;
}

Assistant:

void Sim_SymmsStructCompute( Abc_Ntk_t * pNtk, Vec_Ptr_t * vMatrs, Vec_Ptr_t * vSuppFun )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pTemp;
    int * pMap, i;

    assert( Abc_NtkCiNum(pNtk) + 10 < (1<<16) );

    // get the structural support
    pNtk->vSupps = Sim_ComputeStrSupp( pNtk );
    // set elementary info for the CIs
    Abc_NtkForEachCi( pNtk, pTemp, i )
        SIM_SET_SYMMS( pTemp, Vec_IntAlloc(0) );
    // create the map of CI ids into their numbers
    pMap = Sim_SymmsCreateMap( pNtk );
    // collect the nodes in the TFI cone of this output
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pTemp, i )
    {
//        if ( Abc_NodeIsConst(pTemp) )
//            continue;
        Sim_SymmsStructComputeOne( pNtk, pTemp, pMap );
    }
    // collect the results for the COs;
    Abc_NtkForEachCo( pNtk, pTemp, i )
    {
//printf( "Output %d:\n", i );
        pTemp = Abc_ObjFanin0(pTemp);
        if ( Abc_ObjIsCi(pTemp) || Abc_AigNodeIsConst(pTemp) )
            continue;
        Sim_SymmsTransferToMatrix( (Extra_BitMat_t *)Vec_PtrEntry(vMatrs, i), SIM_READ_SYMMS(pTemp), (unsigned *)Vec_PtrEntry(vSuppFun, i) );
    }
    // clean the intermediate results
    Sim_UtilInfoFree( pNtk->vSupps );
    pNtk->vSupps = NULL;
    Abc_NtkForEachCi( pNtk, pTemp, i )
        Vec_IntFree( SIM_READ_SYMMS(pTemp) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pTemp, i )
//        if ( !Abc_NodeIsConst(pTemp) )
            Vec_IntFree( SIM_READ_SYMMS(pTemp) );
    Vec_PtrFree( vNodes );
    ABC_FREE( pMap );
}